

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTRefCount.hpp
# Opt level: O3

ASTRefCount<antlr::BaseAST> * __thiscall
antlr::ASTRefCount<antlr::BaseAST>::operator=(ASTRefCount<antlr::BaseAST> *this,AST *other)

{
  uint *puVar1;
  ASTRef *this_00;
  ASTRef *pAVar2;
  
  pAVar2 = ASTRef::getRef(other);
  this_00 = this->ref;
  if (this_00 != (ASTRef *)0x0) {
    puVar1 = &this_00->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      ASTRef::~ASTRef(this_00);
      operator_delete(this_00,0x10);
    }
  }
  this->ref = pAVar2;
  return this;
}

Assistant:

ASTRefCount<T>& operator=(AST* other)
	{
		ASTRef* tmp = ASTRef::getRef(other);

		if (ref && ref->decrement())
			delete ref;

		ref=tmp;

		return *this;
	}